

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O0

void __thiscall WorkQueue<CGL::WorkItem>::clear(WorkQueue<CGL::WorkItem> *this)

{
  mutex *in_RDI;
  
  std::mutex::lock(in_RDI);
  std::vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>::clear
            ((vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_> *)0x154f96);
  std::mutex::unlock((mutex *)0x154fa4);
  return;
}

Assistant:

void clear() {
    lock.lock();
    storage.clear();
    lock.unlock();
  }